

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  Vdbe *p;
  int iVar1;
  long lVar2;
  char *pcVar3;
  uchar uVar4;
  uchar uVar5;
  u8 *in_R9;
  long in_FS_OFFSET;
  i64 value;
  int in_stack_ffffffffffffffb8;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  if ((pExpr->flags & 0x800) == 0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    pcVar3 = (pExpr->u).zToken;
    iVar1 = sqlite3DecOrHexToI64(pcVar3,(i64 *)&local_40);
    if ((iVar1 == 2) || (iVar1 == 3 && negFlag == 0)) {
      if (pcVar3 == (char *)0x0) {
LAB_001793f0:
        codeReal(p,pcVar3,negFlag,iMem);
      }
      else {
        lVar2 = 0;
        do {
          if ((ulong)(byte)pcVar3[lVar2] == 0) {
            uVar5 = ""[(byte)"0x"[lVar2]];
            uVar4 = '\0';
LAB_001793be:
            if (uVar4 != uVar5) goto LAB_001793f0;
            break;
          }
          uVar4 = ""[(byte)pcVar3[lVar2]];
          uVar5 = ""[(byte)"0x"[lVar2]];
          if (uVar4 != uVar5) goto LAB_001793be;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 2);
        pcVar3 = "";
        if (negFlag != 0) {
          pcVar3 = "-";
        }
        sqlite3ErrorMsg(pParse,"hex literal too big: %s%#T",pcVar3,pExpr);
      }
    }
    else {
      if ((negFlag != 0) && (local_40 = (undefined1 *)-(long)local_40, iVar1 == 3)) {
        local_40 = (undefined1 *)0x8000000000000000;
      }
      sqlite3VdbeAddOp4Dup8(p,0x48,iMem,(int)&local_40,-0xd,in_R9,in_stack_ffffffffffffffb8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    iVar1 = -(pExpr->u).iValue;
    if (negFlag == 0) {
      iVar1 = (pExpr->u).iValue;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeAddOp3(p,0x47,iVar1,iMem,0);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3DecOrHexToI64(z, &value);
    if( (c==3 && !negFlag) || (c==2) || (negFlag && value==SMALLEST_INT64)){
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%#T", negFlag?"-":"",pExpr);
#else
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( sqlite3_strnicmp(z,"0x",2)==0 ){
        sqlite3ErrorMsg(pParse, "hex literal too big: %s%#T",
                        negFlag?"-":"",pExpr);
      }else
#endif
      {
        codeReal(v, z, negFlag, iMem);
      }
#endif
    }else{
      if( negFlag ){ value = c==3 ? SMALLEST_INT64 : -value; }
      sqlite3VdbeAddOp4Dup8(v, OP_Int64, 0, iMem, 0, (u8*)&value, P4_INT64);
    }
  }
}